

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O3

void AM_clearFB(AMColor *color)

{
  ushort uVar1;
  ushort uVar2;
  FTexture *img;
  int iVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  
  lVar4 = (long)mapback.texnum;
  if ((am_drawmapback.Value != 2) || ((am_customcolors.Value && (AMMod.defined)))) {
    if (am_drawmapback.Value == 0 || lVar4 < 1) goto LAB_00347b6d;
  }
  else if ((am_drawmapback.Value == 0 || lVar4 < 1) || am_colorset.Value != 3) {
LAB_00347b6d:
    (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x13])
              (screen,0,0,(ulong)(uint)f_w,(ulong)(uint)f_h,(ulong)(uint)color->Index,
               (ulong)color->RGB);
    return;
  }
  if ((((uint)mapback.texnum < TexMan.Textures.Count) &&
      (img = TexMan.Textures.Array[lVar4].Texture, img != (FTexture *)0x0)) &&
     (iVar6 = (int)mapystart, iVar6 < f_h)) {
    uVar1 = img->Width;
    uVar2 = img->Height;
    iVar3 = f_h;
    iVar5 = f_w;
    do {
      iVar7 = (int)mapxstart;
      if (iVar7 < iVar5) {
        do {
          DCanvas::DrawTexture
                    ((DCanvas *)screen,img,(double)iVar7,(double)iVar6,0x400013a2,(ulong)(uint)f_h,
                     0x4000139b,0,0x4000139c,0,0);
          iVar7 = iVar7 + (uint)uVar1;
          iVar3 = f_h;
          iVar5 = f_w;
        } while (iVar7 < f_w);
      }
      iVar6 = iVar6 + (uint)uVar2;
    } while (iVar6 < iVar3);
  }
  return;
}

Assistant:

void setInvalid()
	{
		Index = -1;
		RGB = -1;
	}